

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

char * reader_func(lua_State *L,void *ud,size_t *size)

{
  TValue *pTVar1;
  lua_State *in_RDX;
  undefined8 in_RSI;
  lua_State *in_RDI;
  int in_stack_ffffffffffffff78;
  ErrMsg in_stack_ffffffffffffff7c;
  int idx;
  char *local_68;
  
  idx = (int)((ulong)in_RSI >> 0x20);
  luaL_checkstack(in_RDX,in_stack_ffffffffffffff7c,(char *)0x12c7ec);
  pTVar1 = in_RDI->top;
  in_RDI->top = pTVar1 + 1;
  *pTVar1 = *in_RDI->base;
  lua_call(in_RDX,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  in_RDI->top = in_RDI->top + -1;
  if ((in_RDI->top->field_2).it == 0xffffffff) {
    in_RDX->nextgc = 0;
    in_RDX->marked = '\0';
    in_RDX->gct = '\0';
    in_RDX->dummy_ffid = '\0';
    in_RDX->status = '\0';
    local_68 = (char *)0x0;
  }
  else {
    if (((in_RDI->top->field_2).it != 0xfffffffb) && (0xfffeffff < (in_RDI->top->field_2).it)) {
      lj_err_caller(in_RDX,in_stack_ffffffffffffff7c);
    }
    in_RDI->base[4] = *in_RDI->top;
    local_68 = lua_tolstring(in_RDI,idx,(size_t *)in_RDX);
  }
  return local_68;
}

Assistant:

static const char *reader_func(lua_State *L, void *ud, size_t *size)
{
  UNUSED(ud);
  luaL_checkstack(L, 2, "too many nested functions");
  copyTV(L, L->top++, L->base);
  lua_call(L, 0, 1);  /* Call user-supplied function. */
  L->top--;
  if (tvisnil(L->top)) {
    *size = 0;
    return NULL;
  } else if (tvisstr(L->top) || tvisnumber(L->top)) {
    copyTV(L, L->base+4, L->top);  /* Anchor string in reserved stack slot. */
    return lua_tolstring(L, 5, size);
  } else {
    lj_err_caller(L, LJ_ERR_RDRSTR);
    return NULL;
  }
}